

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

Status * __thiscall
draco::Encoder::EncodeMeshToBuffer(Encoder *this,Mesh *m,EncoderBuffer *out_buffer)

{
  bool bVar1;
  size_t sVar2;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *in_RSI;
  Status *in_RDI;
  ExpertEncoder encoder;
  Status *_local_status;
  Mesh *in_stack_fffffffffffffe48;
  ExpertEncoder *in_stack_fffffffffffffe50;
  EncoderBuffer *in_stack_fffffffffffffea0;
  ExpertEncoder *in_stack_fffffffffffffea8;
  PointCloud *in_stack_fffffffffffffed0;
  Encoder *in_stack_fffffffffffffed8;
  EncoderBase<draco::EncoderOptionsBase<int>_> local_d8;
  
  ExpertEncoder::ExpertEncoder(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  CreateExpertEncoderOptions(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  ExpertEncoder::Reset(in_stack_fffffffffffffe50,(EncoderOptions *)in_stack_fffffffffffffe48);
  EncoderOptionsBase<int>::~EncoderOptionsBase((EncoderOptionsBase<int> *)in_stack_fffffffffffffe50)
  ;
  ExpertEncoder::EncodeToBuffer(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  bVar1 = Status::ok(in_RDI);
  if (bVar1) {
    Status::~Status((Status *)0x15658d);
    sVar2 = EncoderBase<draco::EncoderOptionsBase<int>_>::num_encoded_points(&local_d8);
    EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::set_num_encoded_points
              (in_RSI,sVar2);
    sVar2 = EncoderBase<draco::EncoderOptionsBase<int>_>::num_encoded_faces(&local_d8);
    EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::set_num_encoded_faces
              (in_RSI,sVar2);
    OkStatus();
  }
  ExpertEncoder::~ExpertEncoder((ExpertEncoder *)0x156602);
  return in_RDI;
}

Assistant:

Status Encoder::EncodeMeshToBuffer(const Mesh &m, EncoderBuffer *out_buffer) {
  ExpertEncoder encoder(m);
  encoder.Reset(CreateExpertEncoderOptions(m));
  DRACO_RETURN_IF_ERROR(encoder.EncodeToBuffer(out_buffer));
  set_num_encoded_points(encoder.num_encoded_points());
  set_num_encoded_faces(encoder.num_encoded_faces());
  return OkStatus();
}